

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnusedBlockPass.cc
# Opt level: O0

bool flow::transform::eliminateUnusedBlocks(IRHandler *handler)

{
  bool bVar1;
  element_type *peVar2;
  BasicBlock *pBVar3;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *this;
  reference ppBVar4;
  BasicBlock *bb_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *__range2_1;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  local_40;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *local_30;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range2;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> unused;
  IRHandler *handler_local;
  
  unused.super__List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl._M_node.
  _M_size = (size_t)handler;
  std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::list
            ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2);
  local_40 = IRHandler::basicBlocks_abi_cxx11_
                       ((IRHandler *)
                        unused.
                        super__List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                        _M_impl._M_node._M_size);
  local_30 = &local_40;
  __end2 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin(local_30);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end(local_30);
  while( true ) {
    bVar1 = util::
            UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
            ::iterator::operator!=(&__end2,(iterator *)&bb);
    if (!bVar1) break;
    peVar2 = util::
             UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
             ::iterator::operator*(&__end2);
    __range2_1 = (list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)peVar2;
    pBVar3 = IRHandler::getEntryBlock
                       ((IRHandler *)
                        unused.
                        super__List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                        _M_impl._M_node._M_size);
    if (peVar2 != pBVar3) {
      this = BasicBlock::predecessors((BasicBlock *)__range2_1);
      bVar1 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::empty(this);
      if (bVar1) {
        std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::push_back
                  ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2,
                   (value_type *)&__range2_1);
      }
    }
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end2);
  }
  __end2_1 = std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::begin
                       ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2);
  bb_1 = (BasicBlock *)
         std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end
                   ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2);
  while( true ) {
    bVar1 = std::operator!=(&__end2_1,(_Self *)&bb_1);
    if (!bVar1) break;
    ppBVar4 = std::_List_iterator<flow::BasicBlock_*>::operator*(&__end2_1);
    IRHandler::erase((IRHandler *)
                     unused.
                     super__List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                     _M_impl._M_node._M_size,*ppBVar4);
    std::_List_iterator<flow::BasicBlock_*>::operator++(&__end2_1);
  }
  bVar1 = std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::empty
                    ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2);
  std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::~list
            ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool eliminateUnusedBlocks(IRHandler* handler) {
  std::list<BasicBlock*> unused;

  for (BasicBlock* bb : handler->basicBlocks()) {
    if (bb == handler->getEntryBlock())
      continue;

    if (!bb->predecessors().empty())
      continue;

    unused.push_back(bb);
  }

  for (BasicBlock* bb : unused) {
    // FLOW_TRACE("flow: removing unused BasicBlock {}", bb->name());
    handler->erase(bb);
  }

  return !unused.empty();
}